

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

bool libcellml::hasComponentImports(ComponentEntityConstPtr *componentEntity)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  byte local_51;
  shared_ptr<const_libcellml::ComponentEntity> local_50 [2];
  undefined1 local_30 [8];
  ComponentPtr childComponent;
  size_t index;
  bool importsPresent;
  ComponentEntityConstPtr *componentEntity_local;
  
  index._7_1_ = false;
  childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    _Var1._M_pi = childComponent.
                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    peVar2 = std::
             __shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ComponentEntity::componentCount(peVar2)
    ;
    local_51 = 0;
    if (_Var1._M_pi < p_Var3) {
      local_51 = index._7_1_ ^ 0xff;
    }
    if ((local_51 & 1) == 0) break;
    peVar2 = std::
             __shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)componentEntity);
    ComponentEntity::component((ComponentEntity *)local_30,(size_t)peVar2);
    peVar4 = std::
             __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
    index._7_1_ = ImportedEntity::isImport(&peVar4->super_ImportedEntity);
    if (!index._7_1_) {
      std::shared_ptr<libcellml::ComponentEntity_const>::shared_ptr<libcellml::Component,void>
                ((shared_ptr<libcellml::ComponentEntity_const> *)local_50,
                 (shared_ptr<libcellml::Component> *)local_30);
      index._7_1_ = hasComponentImports((ComponentEntityConstPtr *)local_50);
      std::shared_ptr<const_libcellml::ComponentEntity>::~shared_ptr(local_50);
    }
    std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_30)
    ;
    childComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(childComponent.
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi)->_vptr__Sp_counted_base + 1);
  }
  return index._7_1_;
}

Assistant:

bool hasComponentImports(const ComponentEntityConstPtr &componentEntity)
{
    bool importsPresent = false;
    for (size_t index = 0; (index < componentEntity->componentCount()) && !importsPresent; ++index) {
        libcellml::ComponentPtr childComponent = componentEntity->component(index);
        importsPresent = childComponent->isImport();
        if (!importsPresent) {
            importsPresent = hasComponentImports(childComponent);
        }
    }
    return importsPresent;
}